

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

void __thiscall
glcts::ViewportArray::DrawTestBase::prepareTextureR32F(DrawTestBase *this,texture *texture)

{
  uint local_9c;
  undefined4 local_98;
  GLuint i;
  GLfloat data [32];
  texture *texture_local;
  DrawTestBase *this_local;
  
  for (local_9c = 0; local_9c < 0x20; local_9c = local_9c + 1) {
    (&local_98)[local_9c] = 0xbf800000;
  }
  data._120_8_ = texture;
  Utils::texture::create(texture,0x10,2,0x822e);
  Utils::texture::update((texture *)data._120_8_,0x10,2,0,0x1903,0x1406,&local_98);
  return;
}

Assistant:

void DrawTestBase::prepareTextureR32F(Utils::texture& texture)
{
	static const GLuint size = m_r32f_width * m_r32f_height;
	GLfloat				data[size];

	for (GLuint i = 0; i < size; ++i)
	{
		data[i] = -1.0f;
	}

	texture.create(m_r32f_width, m_r32f_height, GL_R32F);
	texture.update(m_r32f_width, m_r32f_height, 0 /* depth */, GL_RED, GL_FLOAT, data);
}